

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

void boost::ext::di::v1_3_0::core::binder::
     resolve<renderer_const&,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,renderer,renderer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>>>
               (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>
                *deps)

{
  type<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_renderer,_renderer,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_11;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>
  *local_10;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_bindings_override_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_boost::ext::di::v1_3_0::core::override,_boost::ext::di::v1_3_0::core::none>_>
  *deps_local;
  
  local_10 = deps;
  resolve_<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::__0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<iclient,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::override,boost::ext::di::v1_3_0::core::none>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,renderer,renderer,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
            (deps,&local_11);
  return;
}

Assistant:

static decltype(auto) resolve(TDeps* deps) noexcept {
    using dependency = dependency_concept<aux::decay_t<T>, TName>;
#if (defined(__CLANG__) && __CLANG__ >= 3'9)  //
    return resolve_(deps, aux::type<decltype(resolve_impl<TDefault, dependency>(aux::declval<TDeps*>()))>{});
#else
    return resolve_impl<TDefault, dependency>(deps);
#endif
  }